

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

void __thiscall mkvmuxer::Track::set_codec_id(Track *this,char *codec_id)

{
  size_t __n;
  char *__dest;
  
  if (codec_id != (char *)0x0) {
    if (this->codec_id_ != (char *)0x0) {
      operator_delete__(this->codec_id_);
    }
    __n = strlen(codec_id);
    __dest = (char *)operator_new__(__n + 1,(nothrow_t *)&std::nothrow);
    this->codec_id_ = __dest;
    if (__dest != (char *)0x0) {
      memcpy(__dest,codec_id,__n);
      __dest[__n] = '\0';
    }
  }
  return;
}

Assistant:

void Track::set_codec_id(const char* codec_id) {
  if (codec_id) {
    delete[] codec_id_;

    const size_t length = strlen(codec_id) + 1;
    codec_id_ = new (std::nothrow) char[length];  // NOLINT
    if (codec_id_) {
      memcpy(codec_id_, codec_id, length - 1);
      codec_id_[length - 1] = '\0';
    }
  }
}